

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  Symbol symbol;
  Descriptor *pDVar1;
  string *full_name;
  string *psVar2;
  Type *proto_00;
  int i;
  long lVar3;
  int size;
  EnumOptions *orig_options;
  long lVar4;
  undefined4 uStack_3c;
  
  pDVar1 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar1 = (Descriptor *)this->file_;
  }
  full_name = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar1 + 8));
  if (full_name->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)full_name,'\x01');
  }
  std::__cxx11::string::append((string *)full_name);
  ValidateSymbolName(this,(proto->name_).ptr_,full_name,&proto->super_Message);
  psVar2 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar2;
  *(string **)(result + 8) = full_name;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  size = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  if (size == 0) {
    AddError(this,full_name,&proto->super_Message,NAME,"Enums must contain at least one value.");
    size = (proto->value_).super_RepeatedPtrFieldBase.current_size_;
  }
  *(int *)(result + 0x2c) = size;
  AllocateArray<google::protobuf::EnumValueDescriptor>
            (this,size,(EnumValueDescriptor **)(result + 0x30));
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (proto->value_).super_RepeatedPtrFieldBase.current_size_;
      lVar3 = lVar3 + 1) {
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                         (&(proto->value_).super_RepeatedPtrFieldBase,(int)lVar3);
    BuildEnumValue(this,proto_00,result,(EnumValueDescriptor *)(*(long *)(result + 0x30) + lVar4));
    lVar4 = lVar4 + 0x28;
  }
  CheckEnumValueUniqueness(this,proto,result);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (EnumOptions *)0x0) {
      orig_options = (EnumOptions *)&_EnumOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::EnumDescriptor>(this,orig_options,result);
  }
  symbol._4_4_ = uStack_3c;
  symbol.type = 4;
  symbol.field_1.enum_descriptor = result;
  AddSymbol(this,*(string **)(result + 8),parent,*(string **)result,&proto->super_Message,symbol);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));
}